

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

pair<robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::Iter<false>,_bool>
* __thiscall
robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::
emplace<robin_hood::pair<char,double>>
          (Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *this
          ,pair<char,_double> *args)

{
  Node *pNVar1;
  pair<char,_double> *in_RDX;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *in_RSI;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *in_RDI;
  pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::InsertionState>
  pVar2;
  char *in_stack_00000008;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
  *in_stack_00000010;
  pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::InsertionState>
  idxAndState;
  Node n;
  Node *in_stack_ffffffffffffff78;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *this_00;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *this_01;
  Iter<false> local_50;
  unsigned_long local_40;
  InsertionState local_38;
  unsigned_long local_30;
  InsertionState local_28;
  uint64_t local_20;
  Node *local_18;
  
  this_01 = (Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *)
            &stack0xffffffffffffffe0;
  this_00 = in_RDI;
  DataNode<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,true>
  ::DataNode<robin_hood::pair<char,double>>
            ((DataNode<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,true>
              *)this_01,in_RSI,in_RDX);
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::getFirstConst
            (this_00,in_stack_ffffffffffffff78);
  pVar2 = insertKeyPrepareEmptySpot<char_const&>(in_stack_00000010,in_stack_00000008);
  local_40 = pVar2.first;
  local_38 = pVar2.second;
  local_30 = local_40;
  local_28 = local_38;
  switch(local_38) {
  case overflow_error:
    Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
    DataNode<robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_true>
    ::destroy((DataNode<robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_true>
               *)&stack0xffffffffffffffe0,in_RSI);
    Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
    throwOverflowError(this_01);
    break;
  case key_found:
    Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
    DataNode<robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_true>
    ::destroy((DataNode<robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_true>
               *)&stack0xffffffffffffffe0,in_RSI);
    break;
  case new_node:
    Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
    DataNode<robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_true>
    ::DataNode(in_RSI->mKeyVals + local_40,in_RSI,
               (DataNode<robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_true>
                *)&stack0xffffffffffffffe0);
    break;
  case overwrite_node:
    pNVar1 = in_RSI->mKeyVals;
    *(uint64_t *)&pNVar1[local_40].mData = local_20;
    pNVar1[local_40].mData.second = (double)local_18;
  }
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::Iter<false>::
  Iter(&local_50,in_RSI->mKeyVals + local_30,in_RSI->mInfo + local_30);
  std::
  make_pair<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::Iter<false>,bool>
            ((Iter<false> *)this_00,(bool *)in_stack_ffffffffffffff78);
  return (pair<robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::Iter<false>,_bool>
          *)in_RDI;
}

Assistant:

std::pair<iterator, bool> emplace(Args&&... args) {
        ROBIN_HOOD_TRACE(this)
        Node n{*this, std::forward<Args>(args)...};
        auto idxAndState = insertKeyPrepareEmptySpot(getFirstConst(n));
        switch (idxAndState.second) {
        case InsertionState::key_found:
            n.destroy(*this);
            break;

        case InsertionState::new_node:
            ::new (static_cast<void*>(&mKeyVals[idxAndState.first])) Node(*this, std::move(n));
            break;

        case InsertionState::overwrite_node:
            mKeyVals[idxAndState.first] = std::move(n);
            break;

        case InsertionState::overflow_error:
            n.destroy(*this);
            throwOverflowError();
            break;
        }

        return std::make_pair(iterator(mKeyVals + idxAndState.first, mInfo + idxAndState.first),
                              InsertionState::key_found != idxAndState.second);
    }